

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void redraw_overlays(void)

{
  int iVar1;
  Fl_Window_Type *local_10;
  Fl_Type *o;
  
  for (local_10 = (Fl_Window_Type *)Fl_Type::first; local_10 != (Fl_Window_Type *)0x0;
      local_10 = (Fl_Window_Type *)(local_10->super_Fl_Widget_Type).super_Fl_Type.next) {
    iVar1 = (*(local_10->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])();
    if (iVar1 != 0) {
      Fl_Window_Type::fix_overlay(local_10);
    }
  }
  return;
}

Assistant:

void redraw_overlays() {
  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) ((Fl_Window_Type*)o)->fix_overlay();
}